

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdefaultrt.hpp
# Opt level: O3

SPxId __thiscall
soplex::
SPxDefaultRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnter(SPxDefaultRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *max,int param_2,bool param_3)

{
  uint *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  Real a;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  double *pdVar14;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  DataKey DVar15;
  undefined7 in_register_00000009;
  fpclass_type fVar16;
  undefined4 in_register_00000014;
  long lVar17;
  long lVar18;
  long lVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  cpp_dec_float<50U,_int,_void> *pcVar23;
  int32_t iVar24;
  long lVar25;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *max_00;
  type t;
  SPxId enterId;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  uint local_234;
  cpp_dec_float<50U,_int,_void> local_228;
  uint local_1ec;
  cpp_dec_float<50U,_int,_void> local_1e8;
  long local_1b0;
  cpp_dec_float<50U,_int,_void> local_1a8;
  cpp_dec_float<50U,_int,_void> local_168;
  SPxDefaultRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_120;
  cpp_dec_float<50U,_int,_void> *local_118;
  DataKey local_110;
  cpp_dec_float<50U,_int,_void> local_108;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  cpp_dec_float<50U,_int,_void> local_a8;
  long local_68;
  long local_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])
                     (this,max,CONCAT44(in_register_00000014,param_2),
                      CONCAT71(in_register_00000009,param_3));
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)(*(long *)(CONCAT44(extraout_var,iVar12) + 0xa58) + 0x50));
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)(*(long *)(CONCAT44(extraout_var_00,iVar12) + 0xa60) + 0x50));
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  local_c8 = **(long **)(CONCAT44(extraout_var_01,iVar12) + 0xa60);
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  lVar18 = *(long *)(*(long *)(CONCAT44(extraout_var_02,iVar12) + 0xa60) + 0x70);
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  lVar19 = *(long *)(CONCAT44(extraout_var_03,iVar12) + 0xa60);
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  local_b8 = **(long **)(CONCAT44(extraout_var_04,iVar12) + 0xa80);
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  local_68 = **(long **)(CONCAT44(extraout_var_05,iVar12) + 0xa78);
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  local_c0 = **(long **)(CONCAT44(extraout_var_06,iVar12) + 0xa58);
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  lVar17 = *(long *)(*(long *)(CONCAT44(extraout_var_07,iVar12) + 0xa58) + 0x70);
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  local_1b0 = *(long *)(CONCAT44(extraout_var_08,iVar12) + 0xa58);
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  local_b0 = **(long **)(CONCAT44(extraout_var_09,iVar12) + 0xa90);
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  local_60 = **(long **)(CONCAT44(extraout_var_10,iVar12) + 0xa88);
  local_128 = this;
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  a = Tolerances::epsilon(*(Tolerances **)(CONCAT44(extraout_var_11,iVar12) + 0x1e0));
  local_a8.fpclass = cpp_dec_float_finite;
  local_a8.prec_elem = 10;
  local_a8.data._M_elems[0] = 0;
  local_a8.data._M_elems[1] = 0;
  local_a8.data._M_elems[2] = 0;
  local_a8.data._M_elems[3] = 0;
  local_a8.data._M_elems[4] = 0;
  local_a8.data._M_elems[5] = 0;
  local_a8.data._M_elems._24_5_ = 0;
  local_a8.data._M_elems[7]._1_3_ = 0;
  local_a8.data._M_elems._32_5_ = 0;
  local_a8.data._M_elems[9]._1_3_ = 0;
  local_a8.exp = 0;
  local_a8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_a8,a);
  local_1a8.data._M_elems._32_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 8);
  local_1a8.data._M_elems._0_8_ = *(undefined8 *)(max->m_backend).data._M_elems;
  local_1a8.data._M_elems._8_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 2);
  local_1a8.data._M_elems._16_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 4);
  local_1a8.data._M_elems._24_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 6);
  local_1a8.exp = (max->m_backend).exp;
  local_1a8.neg = (max->m_backend).neg;
  local_1a8.fpclass = (max->m_backend).fpclass;
  local_1a8.prec_elem = (max->m_backend).prec_elem;
  local_110.info = 0;
  local_110.idx = -1;
  local_108.fpclass = cpp_dec_float_finite;
  local_108.prec_elem = 10;
  local_108.data._M_elems[0] = 0;
  local_108.data._M_elems[1] = 0;
  local_108.data._M_elems[2] = 0;
  local_108.data._M_elems[3] = 0;
  local_108.data._M_elems[4] = 0;
  local_108.data._M_elems[5] = 0;
  local_108.data._M_elems._24_5_ = 0;
  local_108.data._M_elems[7]._1_3_ = 0;
  local_108.data._M_elems._32_5_ = 0;
  local_108.data._M_elems[9]._1_3_ = 0;
  local_108.exp = 0;
  local_108.neg = false;
  local_120 = max;
  if (local_1a8.fpclass == cpp_dec_float_NaN) {
LAB_002cac81:
    local_1ec = 0xffffffff;
    local_234 = 0xffffffff;
    if (0 < *(int *)(lVar19 + 0x58)) {
      pdVar14 = (double *)__tls_get_addr(&PTR_003b4b70);
      local_58 = *pdVar14;
      uStack_50 = 0;
      local_48 = -local_58;
      uStack_40 = 0x8000000000000000;
      local_118 = &(local_128->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).delta.m_backend;
      local_234 = 0xffffffff;
      lVar21 = 0;
      do {
        iVar12 = *(int *)(*(long *)(lVar19 + 0x60) + lVar21 * 4);
        lVar25 = (long)iVar12 * 0x38;
        uVar3 = *(undefined8 *)(lVar18 + 0x20 + lVar25);
        local_108.data._M_elems._32_5_ = SUB85(uVar3,0);
        local_108.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        local_108.data._M_elems._0_8_ = *(undefined8 *)(lVar18 + lVar25);
        local_108.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar18 + lVar25) + 2);
        puVar1 = (uint *)(lVar18 + 0x10 + lVar25);
        local_108.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        uVar3 = *(undefined8 *)(puVar1 + 2);
        local_108.data._M_elems._24_5_ = SUB85(uVar3,0);
        local_108.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        local_108.exp = *(int *)(lVar18 + 0x28 + lVar25);
        local_108.neg = *(bool *)(lVar18 + 0x2c + lVar25);
        local_108._48_8_ = *(undefined8 *)(lVar18 + 0x30 + lVar25);
        if (local_a8.fpclass == cpp_dec_float_NaN || local_108.fpclass == cpp_dec_float_NaN) {
LAB_002cae81:
          uVar3._0_4_ = local_a8.data._M_elems[0];
          uVar3._4_4_ = local_a8.data._M_elems[1];
          local_228.data._M_elems[0] = local_a8.data._M_elems[0];
          local_228.data._M_elems[1] = local_a8.data._M_elems[1];
          uVar9._0_4_ = local_a8.data._M_elems[2];
          uVar9._4_4_ = local_a8.data._M_elems[3];
          local_228.data._M_elems[2] = local_a8.data._M_elems[2];
          local_228.data._M_elems[3] = local_a8.data._M_elems[3];
          local_228.data._M_elems._32_5_ = local_a8.data._M_elems._32_5_;
          local_228.data._M_elems[9]._1_3_ = local_a8.data._M_elems[9]._1_3_;
          local_228.data._M_elems[4] = local_a8.data._M_elems[4];
          local_228.data._M_elems[5] = local_a8.data._M_elems[5];
          local_228.data._M_elems._24_5_ = local_a8.data._M_elems._24_5_;
          local_228.data._M_elems[7]._1_3_ = local_a8.data._M_elems[7]._1_3_;
          local_228.exp = local_a8.exp;
          local_228.neg = local_a8.neg;
          local_228.prec_elem = local_a8.prec_elem;
          local_228.fpclass = local_a8.fpclass;
          if (local_a8.data._M_elems[0] != 0 || local_a8.fpclass != cpp_dec_float_finite) {
            local_228.neg = (bool)(local_a8.neg ^ 1);
          }
          uVar8 = uVar3;
          uVar10 = uVar9;
          if (((local_a8.fpclass != cpp_dec_float_NaN) &&
              (uVar8 = local_228.data._M_elems._0_8_, uVar10 = local_228.data._M_elems._8_8_,
              local_108.fpclass != cpp_dec_float_NaN)) &&
             (local_228.data._M_elems._0_8_ = uVar3, local_228.data._M_elems._8_8_ = uVar9,
             iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_108,&local_228), uVar8 = local_228.data._M_elems._0_8_,
             uVar10 = local_228.data._M_elems._8_8_, iVar13 < 0)) {
            ::soplex::infinity::__tls_init();
            pcVar23 = (cpp_dec_float<50U,_int,_void> *)(local_68 + lVar25);
            local_228.fpclass = cpp_dec_float_finite;
            local_228.prec_elem = 10;
            local_228.data._M_elems[0] = 0;
            local_228.data._M_elems[1] = 0;
            local_228.data._M_elems[2] = 0;
            local_228.data._M_elems[3] = 0;
            local_228.data._M_elems[4] = 0;
            local_228.data._M_elems[5] = 0;
            local_228.data._M_elems._24_5_ = 0;
            local_228.data._M_elems[7]._1_3_ = 0;
            local_228.data._M_elems._32_5_ = 0;
            local_228.data._M_elems[9]._1_3_ = 0;
            local_228.exp = 0;
            local_228.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_228,local_58);
            uVar8 = local_228.data._M_elems._0_8_;
            uVar10 = local_228.data._M_elems._8_8_;
            if (((pcVar23->fpclass != cpp_dec_float_NaN) && (local_228.fpclass != cpp_dec_float_NaN)
                ) && (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare(pcVar23,&local_228), uVar8 = local_228.data._M_elems._0_8_,
                     uVar10 = local_228.data._M_elems._8_8_, iVar13 < 0)) {
              local_1e8.fpclass = cpp_dec_float_finite;
              local_1e8.prec_elem = 10;
              local_1e8.data._M_elems[0] = 0;
              local_1e8.data._M_elems[1] = 0;
              local_1e8.data._M_elems[2] = 0;
              local_1e8.data._M_elems[3] = 0;
              local_1e8.data._M_elems[4] = 0;
              local_1e8.data._M_elems[5] = 0;
              local_1e8.data._M_elems._24_5_ = 0;
              local_1e8.data._M_elems[7]._1_3_ = 0;
              local_1e8.data._M_elems._32_5_ = 0;
              local_1e8.data._M_elems[9]._1_3_ = 0;
              local_1e8.exp = 0;
              local_1e8.neg = false;
              if (&local_1e8 == (cpp_dec_float<50U,_int,_void> *)(lVar25 + local_c8)) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_1e8,pcVar23);
                if (local_1e8.data._M_elems[0] != 0 || local_1e8.fpclass != cpp_dec_float_finite) {
                  local_1e8.neg = (bool)(local_1e8.neg ^ 1);
                }
              }
              else {
                if (&local_1e8 != pcVar23) {
                  uVar3 = *(undefined8 *)((pcVar23->data)._M_elems + 8);
                  local_1e8.data._M_elems._32_5_ = SUB85(uVar3,0);
                  local_1e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                  local_1e8.data._M_elems._0_8_ = *(undefined8 *)(pcVar23->data)._M_elems;
                  local_1e8.data._M_elems._8_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 2);
                  local_1e8.data._M_elems._16_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 4);
                  uVar3 = *(undefined8 *)((pcVar23->data)._M_elems + 6);
                  local_1e8.data._M_elems._24_5_ = SUB85(uVar3,0);
                  local_1e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                  local_1e8.exp = pcVar23->exp;
                  local_1e8.neg = pcVar23->neg;
                  local_1e8.fpclass = pcVar23->fpclass;
                  local_1e8.prec_elem = pcVar23->prec_elem;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_1e8,(cpp_dec_float<50U,_int,_void> *)(lVar25 + local_c8));
              }
              local_168.fpclass = cpp_dec_float_finite;
              local_168.prec_elem = 10;
              local_168.data._M_elems[0] = 0;
              local_168.data._M_elems[1] = 0;
              local_168.data._M_elems[2] = 0;
              local_168.data._M_elems[3] = 0;
              local_168.data._M_elems[4] = 0;
              local_168.data._M_elems[5] = 0;
              local_168.data._M_elems._24_5_ = 0;
              local_168.data._M_elems[7]._1_3_ = 0;
              local_168.data._M_elems._32_5_ = 0;
              local_168.data._M_elems[9]._1_3_ = 0;
              local_168.exp = 0;
              local_168.neg = false;
              pcVar23 = &local_1e8;
              if (&local_168 != local_118) {
                local_168.data._M_elems._32_5_ = local_1e8.data._M_elems._32_5_;
                local_168.data._M_elems[9]._1_3_ = local_1e8.data._M_elems[9]._1_3_;
                local_168.data._M_elems[4] = local_1e8.data._M_elems[4];
                local_168.data._M_elems[5] = local_1e8.data._M_elems[5];
                local_168.data._M_elems._24_5_ = local_1e8.data._M_elems._24_5_;
                local_168.data._M_elems[7]._1_3_ = local_1e8.data._M_elems[7]._1_3_;
                local_168.data._M_elems[0] = local_1e8.data._M_elems[0];
                local_168.data._M_elems[1] = local_1e8.data._M_elems[1];
                local_168.data._M_elems[2] = local_1e8.data._M_elems[2];
                local_168.data._M_elems[3] = local_1e8.data._M_elems[3];
                local_168.exp = local_1e8.exp;
                local_168.neg = local_1e8.neg;
                local_168.fpclass = local_1e8.fpclass;
                local_168.prec_elem = local_1e8.prec_elem;
                pcVar23 = local_118;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_168,pcVar23);
              goto LAB_002cb1bc;
            }
          }
        }
        else {
          iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_108,&local_a8);
          if (iVar13 < 1) {
            goto LAB_002cae81;
          }
          ::soplex::infinity::__tls_init();
          pcVar23 = (cpp_dec_float<50U,_int,_void> *)(local_b8 + lVar25);
          local_228.fpclass = cpp_dec_float_finite;
          local_228.prec_elem = 10;
          local_228.data._M_elems[0] = 0;
          local_228.data._M_elems[1] = 0;
          local_228.data._M_elems[2] = 0;
          local_228.data._M_elems[3] = 0;
          local_228.data._M_elems[4] = 0;
          local_228.data._M_elems[5] = 0;
          local_228.data._M_elems._24_5_ = 0;
          local_228.data._M_elems[7]._1_3_ = 0;
          local_228.data._M_elems._32_5_ = 0;
          local_228.data._M_elems[9]._1_3_ = 0;
          local_228.exp = 0;
          local_228.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_228,local_48);
          uVar8 = local_228.data._M_elems._0_8_;
          uVar10 = local_228.data._M_elems._8_8_;
          if (((pcVar23->fpclass != cpp_dec_float_NaN) && (local_228.fpclass != cpp_dec_float_NaN))
             && (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    (pcVar23,&local_228), uVar8 = local_228.data._M_elems._0_8_,
                uVar10 = local_228.data._M_elems._8_8_, 0 < iVar13)) {
            local_1e8.fpclass = cpp_dec_float_finite;
            local_1e8.prec_elem = 10;
            local_1e8.data._M_elems[0] = 0;
            local_1e8.data._M_elems[1] = 0;
            local_1e8.data._M_elems[2] = 0;
            local_1e8.data._M_elems[3] = 0;
            local_1e8.data._M_elems[4] = 0;
            local_1e8.data._M_elems[5] = 0;
            local_1e8.data._M_elems._24_5_ = 0;
            local_1e8.data._M_elems[7]._1_3_ = 0;
            local_1e8.data._M_elems._32_5_ = 0;
            local_1e8.data._M_elems[9]._1_3_ = 0;
            local_1e8.exp = 0;
            local_1e8.neg = false;
            if (&local_1e8 == (cpp_dec_float<50U,_int,_void> *)(lVar25 + local_c8)) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_1e8,pcVar23);
              if (local_1e8.data._M_elems[0] != 0 || local_1e8.fpclass != cpp_dec_float_finite) {
                local_1e8.neg = (bool)(local_1e8.neg ^ 1);
              }
            }
            else {
              if (&local_1e8 != pcVar23) {
                uVar3 = *(undefined8 *)((pcVar23->data)._M_elems + 8);
                local_1e8.data._M_elems._32_5_ = SUB85(uVar3,0);
                local_1e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_1e8.data._M_elems._0_8_ = *(undefined8 *)(pcVar23->data)._M_elems;
                local_1e8.data._M_elems._8_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 2);
                local_1e8.data._M_elems._16_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 4);
                uVar3 = *(undefined8 *)((pcVar23->data)._M_elems + 6);
                local_1e8.data._M_elems._24_5_ = SUB85(uVar3,0);
                local_1e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_1e8.exp = pcVar23->exp;
                local_1e8.neg = pcVar23->neg;
                local_1e8.fpclass = pcVar23->fpclass;
                local_1e8.prec_elem = pcVar23->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_1e8,(cpp_dec_float<50U,_int,_void> *)(lVar25 + local_c8));
            }
            local_168.fpclass = cpp_dec_float_finite;
            local_168.prec_elem = 10;
            local_168.data._M_elems[0] = 0;
            local_168.data._M_elems[1] = 0;
            local_168.data._M_elems[2] = 0;
            local_168.data._M_elems[3] = 0;
            local_168.data._M_elems[4] = 0;
            local_168.data._M_elems[5] = 0;
            local_168.data._M_elems._24_5_ = 0;
            local_168.data._M_elems[7]._1_3_ = 0;
            local_168.data._M_elems._32_5_ = 0;
            local_168.data._M_elems[9]._1_3_ = 0;
            local_168.exp = 0;
            local_168.neg = false;
            if (&local_168 == local_118) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_168,&local_1e8);
              if (local_168.data._M_elems[0] != 0 || local_168.fpclass != cpp_dec_float_finite) {
                local_168.neg = (bool)(local_168.neg ^ 1);
              }
            }
            else {
              local_168.data._M_elems._32_5_ = local_1e8.data._M_elems._32_5_;
              local_168.data._M_elems[9]._1_3_ = local_1e8.data._M_elems[9]._1_3_;
              local_168.data._M_elems[4] = local_1e8.data._M_elems[4];
              local_168.data._M_elems[5] = local_1e8.data._M_elems[5];
              local_168.data._M_elems._24_5_ = local_1e8.data._M_elems._24_5_;
              local_168.data._M_elems[7]._1_3_ = local_1e8.data._M_elems[7]._1_3_;
              local_168.data._M_elems[0] = local_1e8.data._M_elems[0];
              local_168.data._M_elems[1] = local_1e8.data._M_elems[1];
              local_168.data._M_elems[2] = local_1e8.data._M_elems[2];
              local_168.data._M_elems[3] = local_1e8.data._M_elems[3];
              local_168.exp = local_1e8.exp;
              local_168.neg = local_1e8.neg;
              local_168.fpclass = local_1e8.fpclass;
              local_168.prec_elem = local_1e8.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_168,local_118);
            }
LAB_002cb1bc:
            local_228.fpclass = cpp_dec_float_finite;
            local_228.prec_elem = 10;
            local_228.data._M_elems[0] = 0;
            local_228.data._M_elems[1] = 0;
            local_228.data._M_elems[2] = 0;
            local_228.data._M_elems[3] = 0;
            local_228.data._M_elems[4] = 0;
            local_228.data._M_elems[5] = 0;
            local_228.data._M_elems._24_5_ = 0;
            local_228.data._M_elems[7]._1_3_ = 0;
            local_228.data._M_elems._32_5_ = 0;
            local_228.data._M_elems[9]._1_3_ = 0;
            local_228.exp = 0;
            local_228.neg = false;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_228,&local_168,&local_108);
            uVar8 = local_228.data._M_elems._0_8_;
            uVar10 = local_228.data._M_elems._8_8_;
            if (((local_228.fpclass != cpp_dec_float_NaN) &&
                (local_1a8.fpclass != cpp_dec_float_NaN)) &&
               (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_228,&local_1a8), uVar8 = local_228.data._M_elems._0_8_,
               uVar10 = local_228.data._M_elems._8_8_, 0 < iVar13)) {
              iVar13 = (*(local_128->
                         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._vptr_SPxRatioTester[3])();
              local_110 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ::id((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         *)CONCAT44(extraout_var_13,iVar13),iVar12);
              local_1a8.data._M_elems[4] = local_228.data._M_elems[4];
              local_1a8.data._M_elems[5] = local_228.data._M_elems[5];
              local_1a8.data._M_elems[7]._1_3_ = local_228.data._M_elems[7]._1_3_;
              local_1a8.data._M_elems._24_5_ = local_228.data._M_elems._24_5_;
              local_1a8.data._M_elems[0] = local_228.data._M_elems[0];
              local_1a8.data._M_elems[1] = local_228.data._M_elems[1];
              local_1a8.data._M_elems[2] = local_228.data._M_elems[2];
              local_1a8.data._M_elems[3] = local_228.data._M_elems[3];
              local_1a8.data._M_elems[9]._1_3_ = local_228.data._M_elems[9]._1_3_;
              local_1a8.data._M_elems._32_5_ = local_228.data._M_elems._32_5_;
              local_1a8.exp = local_228.exp;
              local_1a8.neg = local_228.neg;
              local_1a8.fpclass = local_228.fpclass;
              local_1a8.prec_elem = local_228.prec_elem;
              local_234 = (uint)lVar21;
              uVar8 = local_228.data._M_elems._0_8_;
              uVar10 = local_228.data._M_elems._8_8_;
            }
          }
        }
        local_228.data._M_elems._8_8_ = uVar10;
        local_228.data._M_elems._0_8_ = uVar8;
        lVar21 = lVar21 + 1;
      } while (lVar21 < *(int *)(lVar19 + 0x58));
    }
    lVar21 = local_1b0;
    if (0 < *(int *)(local_1b0 + 0x58)) {
      pdVar14 = (double *)__tls_get_addr(&PTR_003b4b70);
      local_58 = *pdVar14;
      uStack_50 = 0;
      local_48 = -local_58;
      uStack_40 = 0x8000000000000000;
      local_118 = &(local_128->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).delta.m_backend;
      local_1ec = 0xffffffff;
      lVar25 = 0;
      do {
        iVar12 = *(int *)(*(long *)(lVar21 + 0x60) + lVar25 * 4);
        lVar22 = (long)iVar12 * 0x38;
        uVar3 = *(undefined8 *)(lVar17 + 0x20 + lVar22);
        local_108.data._M_elems._32_5_ = SUB85(uVar3,0);
        local_108.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        local_108.data._M_elems._0_8_ = *(undefined8 *)(lVar17 + lVar22);
        local_108.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar17 + lVar22) + 2);
        puVar1 = (uint *)(lVar17 + 0x10 + lVar22);
        local_108.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        uVar3 = *(undefined8 *)(puVar1 + 2);
        local_108.data._M_elems._24_5_ = SUB85(uVar3,0);
        local_108.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        local_108.exp = *(int *)(lVar17 + 0x28 + lVar22);
        local_108.neg = *(bool *)(lVar17 + 0x2c + lVar22);
        local_108._48_8_ = *(undefined8 *)(lVar17 + 0x30 + lVar22);
        if (local_a8.fpclass == cpp_dec_float_NaN || local_108.fpclass == cpp_dec_float_NaN) {
LAB_002cb48f:
          uVar8._0_4_ = local_a8.data._M_elems[0];
          uVar8._4_4_ = local_a8.data._M_elems[1];
          local_228.data._M_elems[0] = local_a8.data._M_elems[0];
          local_228.data._M_elems[1] = local_a8.data._M_elems[1];
          uVar10._0_4_ = local_a8.data._M_elems[2];
          uVar10._4_4_ = local_a8.data._M_elems[3];
          local_228.data._M_elems[2] = local_a8.data._M_elems[2];
          local_228.data._M_elems[3] = local_a8.data._M_elems[3];
          local_228.data._M_elems._32_5_ = local_a8.data._M_elems._32_5_;
          local_228.data._M_elems[9]._1_3_ = local_a8.data._M_elems[9]._1_3_;
          local_228.data._M_elems[4] = local_a8.data._M_elems[4];
          local_228.data._M_elems[5] = local_a8.data._M_elems[5];
          local_228.data._M_elems._24_5_ = local_a8.data._M_elems._24_5_;
          local_228.data._M_elems[7]._1_3_ = local_a8.data._M_elems[7]._1_3_;
          local_228.exp = local_a8.exp;
          local_228.neg = local_a8.neg;
          local_228.prec_elem = local_a8.prec_elem;
          local_228.fpclass = local_a8.fpclass;
          if (local_a8.data._M_elems[0] != 0 || local_a8.fpclass != cpp_dec_float_finite) {
            local_228.neg = (bool)(local_a8.neg ^ 1);
          }
          lVar21 = local_1b0;
          uVar3 = uVar8;
          uVar9 = uVar10;
          if (((local_a8.fpclass != cpp_dec_float_NaN) &&
              (uVar3 = local_228.data._M_elems._0_8_, uVar9 = local_228.data._M_elems._8_8_,
              local_108.fpclass != cpp_dec_float_NaN)) &&
             (local_228.data._M_elems._0_8_ = uVar8, local_228.data._M_elems._8_8_ = uVar10,
             iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_108,&local_228), lVar21 = local_1b0,
             uVar3 = local_228.data._M_elems._0_8_, uVar9 = local_228.data._M_elems._8_8_,
             iVar13 < 0)) {
            ::soplex::infinity::__tls_init();
            pcVar23 = (cpp_dec_float<50U,_int,_void> *)(local_60 + lVar22);
            local_228.fpclass = cpp_dec_float_finite;
            local_228.prec_elem = 10;
            local_228.data._M_elems[0] = 0;
            local_228.data._M_elems[1] = 0;
            local_228.data._M_elems[2] = 0;
            local_228.data._M_elems[3] = 0;
            local_228.data._M_elems[4] = 0;
            local_228.data._M_elems[5] = 0;
            local_228.data._M_elems._24_5_ = 0;
            local_228.data._M_elems[7]._1_3_ = 0;
            local_228.data._M_elems._32_5_ = 0;
            local_228.data._M_elems[9]._1_3_ = 0;
            local_228.exp = 0;
            local_228.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_228,local_58);
            lVar21 = local_1b0;
            uVar3 = local_228.data._M_elems._0_8_;
            uVar9 = local_228.data._M_elems._8_8_;
            if (((pcVar23->fpclass != cpp_dec_float_NaN) && (local_228.fpclass != cpp_dec_float_NaN)
                ) && (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare(pcVar23,&local_228), lVar21 = local_1b0,
                     uVar3 = local_228.data._M_elems._0_8_, uVar9 = local_228.data._M_elems._8_8_,
                     iVar13 < 0)) {
              local_1e8.fpclass = cpp_dec_float_finite;
              local_1e8.prec_elem = 10;
              local_1e8.data._M_elems[0] = 0;
              local_1e8.data._M_elems[1] = 0;
              local_1e8.data._M_elems[2] = 0;
              local_1e8.data._M_elems[3] = 0;
              local_1e8.data._M_elems[4] = 0;
              local_1e8.data._M_elems[5] = 0;
              local_1e8.data._M_elems._24_5_ = 0;
              local_1e8.data._M_elems[7]._1_3_ = 0;
              local_1e8.data._M_elems._32_5_ = 0;
              local_1e8.data._M_elems[9]._1_3_ = 0;
              local_1e8.exp = 0;
              local_1e8.neg = false;
              if (&local_1e8 == (cpp_dec_float<50U,_int,_void> *)(lVar22 + local_c0)) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_1e8,pcVar23);
                if (local_1e8.data._M_elems[0] != 0 || local_1e8.fpclass != cpp_dec_float_finite) {
                  local_1e8.neg = (bool)(local_1e8.neg ^ 1);
                }
              }
              else {
                if (&local_1e8 != pcVar23) {
                  uVar3 = *(undefined8 *)((pcVar23->data)._M_elems + 8);
                  local_1e8.data._M_elems._32_5_ = SUB85(uVar3,0);
                  local_1e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                  local_1e8.data._M_elems._0_8_ = *(undefined8 *)(pcVar23->data)._M_elems;
                  local_1e8.data._M_elems._8_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 2);
                  local_1e8.data._M_elems._16_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 4);
                  uVar3 = *(undefined8 *)((pcVar23->data)._M_elems + 6);
                  local_1e8.data._M_elems._24_5_ = SUB85(uVar3,0);
                  local_1e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                  local_1e8.exp = pcVar23->exp;
                  local_1e8.neg = pcVar23->neg;
                  local_1e8.fpclass = pcVar23->fpclass;
                  local_1e8.prec_elem = pcVar23->prec_elem;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_1e8,(cpp_dec_float<50U,_int,_void> *)(lVar22 + local_c0));
              }
              lVar21 = local_1b0;
              local_168.fpclass = cpp_dec_float_finite;
              local_168.prec_elem = 10;
              local_168.data._M_elems[0] = 0;
              local_168.data._M_elems[1] = 0;
              local_168.data._M_elems[2] = 0;
              local_168.data._M_elems[3] = 0;
              local_168.data._M_elems[4] = 0;
              local_168.data._M_elems[5] = 0;
              local_168.data._M_elems._24_5_ = 0;
              local_168.data._M_elems[7]._1_3_ = 0;
              local_168.data._M_elems._32_5_ = 0;
              local_168.data._M_elems[9]._1_3_ = 0;
              local_168.exp = 0;
              local_168.neg = false;
              pcVar23 = &local_1e8;
              if (&local_168 != local_118) {
                local_168.data._M_elems._32_5_ = local_1e8.data._M_elems._32_5_;
                local_168.data._M_elems[9]._1_3_ = local_1e8.data._M_elems[9]._1_3_;
                local_168.data._M_elems[4] = local_1e8.data._M_elems[4];
                local_168.data._M_elems[5] = local_1e8.data._M_elems[5];
                local_168.data._M_elems._24_5_ = local_1e8.data._M_elems._24_5_;
                local_168.data._M_elems[7]._1_3_ = local_1e8.data._M_elems[7]._1_3_;
                local_168.data._M_elems[0] = local_1e8.data._M_elems[0];
                local_168.data._M_elems[1] = local_1e8.data._M_elems[1];
                local_168.data._M_elems[2] = local_1e8.data._M_elems[2];
                local_168.data._M_elems[3] = local_1e8.data._M_elems[3];
                local_168.exp = local_1e8.exp;
                local_168.neg = local_1e8.neg;
                local_168.fpclass = local_1e8.fpclass;
                local_168.prec_elem = local_1e8.prec_elem;
                pcVar23 = local_118;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_168,pcVar23);
              goto LAB_002cb7df;
            }
          }
        }
        else {
          iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_108,&local_a8);
          if (iVar13 < 1) {
            goto LAB_002cb48f;
          }
          ::soplex::infinity::__tls_init();
          pcVar23 = (cpp_dec_float<50U,_int,_void> *)(local_b0 + lVar22);
          local_228.fpclass = cpp_dec_float_finite;
          local_228.prec_elem = 10;
          local_228.data._M_elems[0] = 0;
          local_228.data._M_elems[1] = 0;
          local_228.data._M_elems[2] = 0;
          local_228.data._M_elems[3] = 0;
          local_228.data._M_elems[4] = 0;
          local_228.data._M_elems[5] = 0;
          local_228.data._M_elems._24_5_ = 0;
          local_228.data._M_elems[7]._1_3_ = 0;
          local_228.data._M_elems._32_5_ = 0;
          local_228.data._M_elems[9]._1_3_ = 0;
          local_228.exp = 0;
          local_228.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_228,local_48);
          lVar21 = local_1b0;
          uVar3 = local_228.data._M_elems._0_8_;
          uVar9 = local_228.data._M_elems._8_8_;
          if (((pcVar23->fpclass != cpp_dec_float_NaN) && (local_228.fpclass != cpp_dec_float_NaN))
             && (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    (pcVar23,&local_228), lVar21 = local_1b0,
                uVar3 = local_228.data._M_elems._0_8_, uVar9 = local_228.data._M_elems._8_8_,
                0 < iVar13)) {
            local_1e8.fpclass = cpp_dec_float_finite;
            local_1e8.prec_elem = 10;
            local_1e8.data._M_elems[0] = 0;
            local_1e8.data._M_elems[1] = 0;
            local_1e8.data._M_elems[2] = 0;
            local_1e8.data._M_elems[3] = 0;
            local_1e8.data._M_elems[4] = 0;
            local_1e8.data._M_elems[5] = 0;
            local_1e8.data._M_elems._24_5_ = 0;
            local_1e8.data._M_elems[7]._1_3_ = 0;
            local_1e8.data._M_elems._32_5_ = 0;
            local_1e8.data._M_elems[9]._1_3_ = 0;
            local_1e8.exp = 0;
            local_1e8.neg = false;
            if (&local_1e8 == (cpp_dec_float<50U,_int,_void> *)(lVar22 + local_c0)) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_1e8,pcVar23);
              if (local_1e8.data._M_elems[0] != 0 || local_1e8.fpclass != cpp_dec_float_finite) {
                local_1e8.neg = (bool)(local_1e8.neg ^ 1);
              }
            }
            else {
              if (&local_1e8 != pcVar23) {
                uVar3 = *(undefined8 *)((pcVar23->data)._M_elems + 8);
                local_1e8.data._M_elems._32_5_ = SUB85(uVar3,0);
                local_1e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_1e8.data._M_elems._0_8_ = *(undefined8 *)(pcVar23->data)._M_elems;
                local_1e8.data._M_elems._8_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 2);
                local_1e8.data._M_elems._16_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 4);
                uVar3 = *(undefined8 *)((pcVar23->data)._M_elems + 6);
                local_1e8.data._M_elems._24_5_ = SUB85(uVar3,0);
                local_1e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_1e8.exp = pcVar23->exp;
                local_1e8.neg = pcVar23->neg;
                local_1e8.fpclass = pcVar23->fpclass;
                local_1e8.prec_elem = pcVar23->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_1e8,(cpp_dec_float<50U,_int,_void> *)(lVar22 + local_c0));
            }
            lVar21 = local_1b0;
            local_168.fpclass = cpp_dec_float_finite;
            local_168.prec_elem = 10;
            local_168.data._M_elems[0] = 0;
            local_168.data._M_elems[1] = 0;
            local_168.data._M_elems[2] = 0;
            local_168.data._M_elems[3] = 0;
            local_168.data._M_elems[4] = 0;
            local_168.data._M_elems[5] = 0;
            local_168.data._M_elems._24_5_ = 0;
            local_168.data._M_elems[7]._1_3_ = 0;
            local_168.data._M_elems._32_5_ = 0;
            local_168.data._M_elems[9]._1_3_ = 0;
            local_168.exp = 0;
            local_168.neg = false;
            if (&local_168 == local_118) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_168,&local_1e8);
              if (local_168.data._M_elems[0] != 0 || local_168.fpclass != cpp_dec_float_finite) {
                local_168.neg = (bool)(local_168.neg ^ 1);
              }
            }
            else {
              local_168.data._M_elems._32_5_ = local_1e8.data._M_elems._32_5_;
              local_168.data._M_elems[9]._1_3_ = local_1e8.data._M_elems[9]._1_3_;
              local_168.data._M_elems[4] = local_1e8.data._M_elems[4];
              local_168.data._M_elems[5] = local_1e8.data._M_elems[5];
              local_168.data._M_elems._24_5_ = local_1e8.data._M_elems._24_5_;
              local_168.data._M_elems[7]._1_3_ = local_1e8.data._M_elems[7]._1_3_;
              local_168.data._M_elems[0] = local_1e8.data._M_elems[0];
              local_168.data._M_elems[1] = local_1e8.data._M_elems[1];
              local_168.data._M_elems[2] = local_1e8.data._M_elems[2];
              local_168.data._M_elems[3] = local_1e8.data._M_elems[3];
              local_168.exp = local_1e8.exp;
              local_168.neg = local_1e8.neg;
              local_168.fpclass = local_1e8.fpclass;
              local_168.prec_elem = local_1e8.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_168,local_118);
            }
LAB_002cb7df:
            local_228.fpclass = cpp_dec_float_finite;
            local_228.prec_elem = 10;
            local_228.data._M_elems[0] = 0;
            local_228.data._M_elems[1] = 0;
            local_228.data._M_elems[2] = 0;
            local_228.data._M_elems[3] = 0;
            local_228.data._M_elems[4] = 0;
            local_228.data._M_elems[5] = 0;
            local_228.data._M_elems._24_5_ = 0;
            local_228.data._M_elems[7]._1_3_ = 0;
            local_228.data._M_elems._32_5_ = 0;
            local_228.data._M_elems[9]._1_3_ = 0;
            local_228.exp = 0;
            local_228.neg = false;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_228,&local_168,&local_108);
            uVar3 = local_228.data._M_elems._0_8_;
            uVar9 = local_228.data._M_elems._8_8_;
            if (((local_228.fpclass != cpp_dec_float_NaN) &&
                (local_1a8.fpclass != cpp_dec_float_NaN)) &&
               (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_228,&local_1a8), uVar3 = local_228.data._M_elems._0_8_,
               uVar9 = local_228.data._M_elems._8_8_, 0 < iVar13)) {
              iVar13 = (*(local_128->
                         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._vptr_SPxRatioTester[3])();
              local_110 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ::coId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           *)CONCAT44(extraout_var_14,iVar13),iVar12);
              local_1a8.data._M_elems[4] = local_228.data._M_elems[4];
              local_1a8.data._M_elems[5] = local_228.data._M_elems[5];
              local_1a8.data._M_elems[7]._1_3_ = local_228.data._M_elems[7]._1_3_;
              local_1a8.data._M_elems._24_5_ = local_228.data._M_elems._24_5_;
              local_1a8.data._M_elems[0] = local_228.data._M_elems[0];
              local_1a8.data._M_elems[1] = local_228.data._M_elems[1];
              local_1a8.data._M_elems[2] = local_228.data._M_elems[2];
              local_1a8.data._M_elems[3] = local_228.data._M_elems[3];
              local_1a8.data._M_elems[9]._1_3_ = local_228.data._M_elems[9]._1_3_;
              local_1a8.data._M_elems._32_5_ = local_228.data._M_elems._32_5_;
              local_1a8.exp = local_228.exp;
              local_1a8.neg = local_228.neg;
              local_1a8.fpclass = local_228.fpclass;
              local_1a8.prec_elem = local_228.prec_elem;
              local_1ec = (uint)lVar25;
              uVar3 = local_228.data._M_elems._0_8_;
              uVar9 = local_228.data._M_elems._8_8_;
            }
          }
        }
        local_228.data._M_elems._8_8_ = uVar9;
        local_228.data._M_elems._0_8_ = uVar3;
        lVar22 = local_b0;
        max_00 = local_120;
        uVar20 = local_1ec;
        lVar25 = lVar25 + 1;
      } while (lVar25 < *(int *)(lVar21 + 0x58));
      if (-1 < (int)local_1ec) {
        lVar18 = (long)*(int *)(*(long *)(local_1b0 + 0x60) + (ulong)local_1ec * 4) * 0x38;
        uVar3 = *(undefined8 *)(lVar17 + 0x20 + lVar18);
        local_108.data._M_elems._32_5_ = SUB85(uVar3,0);
        local_108.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        local_108.data._M_elems._0_8_ = *(undefined8 *)(lVar17 + lVar18);
        local_108.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar17 + lVar18) + 2);
        puVar1 = (uint *)(lVar17 + 0x10 + lVar18);
        local_108.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        uVar3 = *(undefined8 *)(puVar1 + 2);
        local_108.data._M_elems._24_5_ = SUB85(uVar3,0);
        local_108.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        local_108.exp = *(int *)(lVar17 + 0x28 + lVar18);
        local_108.neg = *(bool *)(lVar17 + 0x2c + lVar18);
        local_108._48_8_ = *(undefined8 *)(lVar17 + 0x30 + lVar18);
        if (((local_108.fpclass != cpp_dec_float_NaN) && (local_a8.fpclass != cpp_dec_float_NaN)) &&
           (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_108,&local_a8), iVar12 < 0)) {
          lVar22 = local_60;
        }
        goto LAB_002cc1fc;
      }
    }
    lVar17 = local_b8;
    uVar20 = local_1ec;
    max_00 = local_120;
    if ((int)local_234 < 0) goto LAB_002cc411;
    lVar19 = (long)*(int *)(*(long *)(lVar19 + 0x60) + (ulong)local_234 * 4) * 0x38;
    uVar3 = *(undefined8 *)(lVar18 + 0x20 + lVar19);
    local_108.data._M_elems._32_5_ = SUB85(uVar3,0);
    local_108.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
    local_108.data._M_elems._0_8_ = *(undefined8 *)(lVar18 + lVar19);
    local_108.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar18 + lVar19) + 2);
    puVar1 = (uint *)(lVar18 + 0x10 + lVar19);
    local_108.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    uVar3 = *(undefined8 *)(puVar1 + 2);
    local_108.data._M_elems._24_5_ = SUB85(uVar3,0);
    local_108.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
    local_108.exp = *(int *)(lVar18 + 0x28 + lVar19);
    local_108.neg = *(bool *)(lVar18 + 0x2c + lVar19);
    local_108._48_8_ = *(undefined8 *)(lVar18 + 0x30 + lVar19);
    if (((local_108.fpclass != cpp_dec_float_NaN) && (local_a8.fpclass != cpp_dec_float_NaN)) &&
       (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_108,&local_a8), iVar12 < 0)) {
      lVar17 = local_68;
    }
LAB_002cc2aa:
    local_1a8.data._M_elems._32_8_ = *(undefined8 *)(lVar17 + 0x20 + lVar19);
    local_1a8.data._M_elems._0_8_ = *(undefined8 *)(lVar17 + lVar19);
    local_1a8.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar17 + lVar19) + 2);
    puVar1 = (uint *)(lVar17 + 0x10 + lVar19);
    local_1a8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_1a8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_1a8.exp = *(int *)(lVar17 + 0x28 + lVar19);
    local_1a8.neg = *(bool *)(lVar17 + 0x2c + lVar19);
    fVar16 = *(fpclass_type *)(lVar17 + 0x30 + lVar19);
    iVar24 = *(int32_t *)(lVar17 + 0x34 + lVar19);
    local_1a8.prec_elem = iVar24;
    local_1a8.fpclass = fVar16;
    pcVar23 = (cpp_dec_float<50U,_int,_void> *)(local_c8 + lVar19);
    max_00 = local_120;
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&local_228,0,(type *)0x0);
    iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_1a8,&local_228);
    if (iVar12 < 1) goto LAB_002cac81;
    local_1ec = 0xffffffff;
    local_234 = 0xffffffff;
    if (0 < *(int *)(lVar19 + 0x58)) {
      pdVar14 = (double *)__tls_get_addr(&PTR_003b4b70);
      local_48 = *pdVar14;
      local_118 = &(local_128->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).delta.m_backend;
      uStack_40 = 0;
      local_58 = -local_48;
      uStack_50 = 0x8000000000000000;
      local_234 = 0xffffffff;
      lVar21 = 0;
      do {
        iVar12 = *(int *)(*(long *)(lVar19 + 0x60) + lVar21 * 4);
        lVar25 = (long)iVar12 * 0x38;
        uVar3 = *(undefined8 *)(lVar18 + 0x20 + lVar25);
        local_108.data._M_elems._32_5_ = SUB85(uVar3,0);
        local_108.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        local_108.data._M_elems._0_8_ = *(undefined8 *)(lVar18 + lVar25);
        local_108.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar18 + lVar25) + 2);
        puVar1 = (uint *)(lVar18 + 0x10 + lVar25);
        local_108.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        uVar3 = *(undefined8 *)(puVar1 + 2);
        local_108.data._M_elems._24_5_ = SUB85(uVar3,0);
        local_108.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        local_108.exp = *(int *)(lVar18 + 0x28 + lVar25);
        local_108.neg = *(bool *)(lVar18 + 0x2c + lVar25);
        local_108._48_8_ = *(undefined8 *)(lVar18 + 0x30 + lVar25);
        if (local_a8.fpclass == cpp_dec_float_NaN || local_108.fpclass == cpp_dec_float_NaN) {
LAB_002ca860:
          uVar4._0_4_ = local_a8.data._M_elems[0];
          uVar4._4_4_ = local_a8.data._M_elems[1];
          local_228.data._M_elems[0] = local_a8.data._M_elems[0];
          local_228.data._M_elems[1] = local_a8.data._M_elems[1];
          uVar5._0_4_ = local_a8.data._M_elems[2];
          uVar5._4_4_ = local_a8.data._M_elems[3];
          local_228.data._M_elems[2] = local_a8.data._M_elems[2];
          local_228.data._M_elems[3] = local_a8.data._M_elems[3];
          local_228.data._M_elems._32_5_ = local_a8.data._M_elems._32_5_;
          local_228.data._M_elems[9]._1_3_ = local_a8.data._M_elems[9]._1_3_;
          local_228.data._M_elems[4] = local_a8.data._M_elems[4];
          local_228.data._M_elems[5] = local_a8.data._M_elems[5];
          local_228.data._M_elems._24_5_ = local_a8.data._M_elems._24_5_;
          local_228.data._M_elems[7]._1_3_ = local_a8.data._M_elems[7]._1_3_;
          local_228.exp = local_a8.exp;
          local_228.neg = local_a8.neg;
          local_228.prec_elem = local_a8.prec_elem;
          local_228.fpclass = local_a8.fpclass;
          if (local_a8.data._M_elems[0] != 0 || local_a8.fpclass != cpp_dec_float_finite) {
            local_228.neg = (bool)(local_a8.neg ^ 1);
          }
          uVar3 = uVar4;
          uVar9 = uVar5;
          if (((local_a8.fpclass != cpp_dec_float_NaN) &&
              (uVar3 = local_228.data._M_elems._0_8_, uVar9 = local_228.data._M_elems._8_8_,
              local_108.fpclass != cpp_dec_float_NaN)) &&
             (local_228.data._M_elems._0_8_ = uVar4, local_228.data._M_elems._8_8_ = uVar5,
             iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_108,&local_228), uVar3 = local_228.data._M_elems._0_8_,
             uVar9 = local_228.data._M_elems._8_8_, iVar13 < 0)) {
            ::soplex::infinity::__tls_init();
            pcVar23 = (cpp_dec_float<50U,_int,_void> *)(local_b8 + lVar25);
            local_228.fpclass = cpp_dec_float_finite;
            local_228.prec_elem = 10;
            local_228.data._M_elems[0] = 0;
            local_228.data._M_elems[1] = 0;
            local_228.data._M_elems[2] = 0;
            local_228.data._M_elems[3] = 0;
            local_228.data._M_elems[4] = 0;
            local_228.data._M_elems[5] = 0;
            local_228.data._M_elems._24_5_ = 0;
            local_228.data._M_elems[7]._1_3_ = 0;
            local_228.data._M_elems._32_5_ = 0;
            local_228.data._M_elems[9]._1_3_ = 0;
            local_228.exp = 0;
            local_228.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_228,local_58);
            uVar3 = local_228.data._M_elems._0_8_;
            uVar9 = local_228.data._M_elems._8_8_;
            if (((pcVar23->fpclass != cpp_dec_float_NaN) && (local_228.fpclass != cpp_dec_float_NaN)
                ) && (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare(pcVar23,&local_228), uVar3 = local_228.data._M_elems._0_8_,
                     uVar9 = local_228.data._M_elems._8_8_, 0 < iVar13)) {
              local_1e8.fpclass = cpp_dec_float_finite;
              local_1e8.prec_elem = 10;
              local_1e8.data._M_elems[0] = 0;
              local_1e8.data._M_elems[1] = 0;
              local_1e8.data._M_elems[2] = 0;
              local_1e8.data._M_elems[3] = 0;
              local_1e8.data._M_elems[4] = 0;
              local_1e8.data._M_elems[5] = 0;
              local_1e8.data._M_elems._24_5_ = 0;
              local_1e8.data._M_elems[7]._1_3_ = 0;
              local_1e8.data._M_elems._32_5_ = 0;
              local_1e8.data._M_elems[9]._1_3_ = 0;
              local_1e8.exp = 0;
              local_1e8.neg = false;
              if (&local_1e8 == (cpp_dec_float<50U,_int,_void> *)(lVar25 + local_c8)) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_1e8,pcVar23);
                if (local_1e8.data._M_elems[0] != 0 || local_1e8.fpclass != cpp_dec_float_finite) {
                  local_1e8.neg = (bool)(local_1e8.neg ^ 1);
                }
              }
              else {
                if (&local_1e8 != pcVar23) {
                  uVar3 = *(undefined8 *)((pcVar23->data)._M_elems + 8);
                  local_1e8.data._M_elems._32_5_ = SUB85(uVar3,0);
                  local_1e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                  local_1e8.data._M_elems._0_8_ = *(undefined8 *)(pcVar23->data)._M_elems;
                  local_1e8.data._M_elems._8_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 2);
                  local_1e8.data._M_elems._16_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 4);
                  uVar3 = *(undefined8 *)((pcVar23->data)._M_elems + 6);
                  local_1e8.data._M_elems._24_5_ = SUB85(uVar3,0);
                  local_1e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                  local_1e8.exp = pcVar23->exp;
                  local_1e8.neg = pcVar23->neg;
                  local_1e8.fpclass = pcVar23->fpclass;
                  local_1e8.prec_elem = pcVar23->prec_elem;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_1e8,(cpp_dec_float<50U,_int,_void> *)(lVar25 + local_c8));
              }
              local_168.fpclass = cpp_dec_float_finite;
              local_168.prec_elem = 10;
              local_168.data._M_elems[0] = 0;
              local_168.data._M_elems[1] = 0;
              local_168.data._M_elems[2] = 0;
              local_168.data._M_elems[3] = 0;
              local_168.data._M_elems[4] = 0;
              local_168.data._M_elems[5] = 0;
              local_168.data._M_elems._24_5_ = 0;
              local_168.data._M_elems[7]._1_3_ = 0;
              local_168.data._M_elems._32_5_ = 0;
              local_168.data._M_elems[9]._1_3_ = 0;
              local_168.exp = 0;
              local_168.neg = false;
              if (&local_168 == local_118) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_168,&local_1e8);
                if (local_168.data._M_elems[0] != 0 || local_168.fpclass != cpp_dec_float_finite) {
                  local_168.neg = (bool)(local_168.neg ^ 1);
                }
              }
              else {
                local_168.data._M_elems._32_5_ = local_1e8.data._M_elems._32_5_;
                local_168.data._M_elems[9]._1_3_ = local_1e8.data._M_elems[9]._1_3_;
                local_168.data._M_elems[4] = local_1e8.data._M_elems[4];
                local_168.data._M_elems[5] = local_1e8.data._M_elems[5];
                local_168.data._M_elems._24_5_ = local_1e8.data._M_elems._24_5_;
                local_168.data._M_elems[7]._1_3_ = local_1e8.data._M_elems[7]._1_3_;
                local_168.data._M_elems[0] = local_1e8.data._M_elems[0];
                local_168.data._M_elems[1] = local_1e8.data._M_elems[1];
                local_168.data._M_elems[2] = local_1e8.data._M_elems[2];
                local_168.data._M_elems[3] = local_1e8.data._M_elems[3];
                local_168.exp = local_1e8.exp;
                local_168.neg = local_1e8.neg;
                local_168.fpclass = local_1e8.fpclass;
                local_168.prec_elem = local_1e8.prec_elem;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_168,local_118);
              }
              goto LAB_002caba4;
            }
          }
        }
        else {
          iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_108,&local_a8);
          if (iVar13 < 1) {
            goto LAB_002ca860;
          }
          ::soplex::infinity::__tls_init();
          pcVar23 = (cpp_dec_float<50U,_int,_void> *)(local_68 + lVar25);
          local_228.fpclass = cpp_dec_float_finite;
          local_228.prec_elem = 10;
          local_228.data._M_elems[0] = 0;
          local_228.data._M_elems[1] = 0;
          local_228.data._M_elems[2] = 0;
          local_228.data._M_elems[3] = 0;
          local_228.data._M_elems[4] = 0;
          local_228.data._M_elems[5] = 0;
          local_228.data._M_elems._24_5_ = 0;
          local_228.data._M_elems[7]._1_3_ = 0;
          local_228.data._M_elems._32_5_ = 0;
          local_228.data._M_elems[9]._1_3_ = 0;
          local_228.exp = 0;
          local_228.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_228,local_48);
          uVar3 = local_228.data._M_elems._0_8_;
          uVar9 = local_228.data._M_elems._8_8_;
          if (((pcVar23->fpclass != cpp_dec_float_NaN) && (local_228.fpclass != cpp_dec_float_NaN))
             && (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    (pcVar23,&local_228), uVar3 = local_228.data._M_elems._0_8_,
                uVar9 = local_228.data._M_elems._8_8_, iVar13 < 0)) {
            local_1e8.fpclass = cpp_dec_float_finite;
            local_1e8.prec_elem = 10;
            local_1e8.data._M_elems[0] = 0;
            local_1e8.data._M_elems[1] = 0;
            local_1e8.data._M_elems[2] = 0;
            local_1e8.data._M_elems[3] = 0;
            local_1e8.data._M_elems[4] = 0;
            local_1e8.data._M_elems[5] = 0;
            local_1e8.data._M_elems._24_5_ = 0;
            local_1e8.data._M_elems[7]._1_3_ = 0;
            local_1e8.data._M_elems._32_5_ = 0;
            local_1e8.data._M_elems[9]._1_3_ = 0;
            local_1e8.exp = 0;
            local_1e8.neg = false;
            if (&local_1e8 == (cpp_dec_float<50U,_int,_void> *)(lVar25 + local_c8)) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_1e8,pcVar23);
              if (local_1e8.data._M_elems[0] != 0 || local_1e8.fpclass != cpp_dec_float_finite) {
                local_1e8.neg = (bool)(local_1e8.neg ^ 1);
              }
            }
            else {
              if (&local_1e8 != pcVar23) {
                uVar3 = *(undefined8 *)((pcVar23->data)._M_elems + 8);
                local_1e8.data._M_elems._32_5_ = SUB85(uVar3,0);
                local_1e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_1e8.data._M_elems._0_8_ = *(undefined8 *)(pcVar23->data)._M_elems;
                local_1e8.data._M_elems._8_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 2);
                local_1e8.data._M_elems._16_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 4);
                uVar3 = *(undefined8 *)((pcVar23->data)._M_elems + 6);
                local_1e8.data._M_elems._24_5_ = SUB85(uVar3,0);
                local_1e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_1e8.exp = pcVar23->exp;
                local_1e8.neg = pcVar23->neg;
                local_1e8.fpclass = pcVar23->fpclass;
                local_1e8.prec_elem = pcVar23->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_1e8,(cpp_dec_float<50U,_int,_void> *)(lVar25 + local_c8));
            }
            local_168.fpclass = cpp_dec_float_finite;
            local_168.prec_elem = 10;
            local_168.data._M_elems[0] = 0;
            local_168.data._M_elems[1] = 0;
            local_168.data._M_elems[2] = 0;
            local_168.data._M_elems[3] = 0;
            local_168.data._M_elems[4] = 0;
            local_168.data._M_elems[5] = 0;
            local_168.data._M_elems._24_5_ = 0;
            local_168.data._M_elems[7]._1_3_ = 0;
            local_168.data._M_elems._32_5_ = 0;
            local_168.data._M_elems[9]._1_3_ = 0;
            local_168.exp = 0;
            local_168.neg = false;
            pcVar23 = &local_1e8;
            if (&local_168 != local_118) {
              local_168.data._M_elems._32_5_ = local_1e8.data._M_elems._32_5_;
              local_168.data._M_elems[9]._1_3_ = local_1e8.data._M_elems[9]._1_3_;
              local_168.data._M_elems[4] = local_1e8.data._M_elems[4];
              local_168.data._M_elems[5] = local_1e8.data._M_elems[5];
              local_168.data._M_elems._24_5_ = local_1e8.data._M_elems._24_5_;
              local_168.data._M_elems[7]._1_3_ = local_1e8.data._M_elems[7]._1_3_;
              local_168.data._M_elems[0] = local_1e8.data._M_elems[0];
              local_168.data._M_elems[1] = local_1e8.data._M_elems[1];
              local_168.data._M_elems[2] = local_1e8.data._M_elems[2];
              local_168.data._M_elems[3] = local_1e8.data._M_elems[3];
              local_168.exp = local_1e8.exp;
              local_168.neg = local_1e8.neg;
              local_168.fpclass = local_1e8.fpclass;
              local_168.prec_elem = local_1e8.prec_elem;
              pcVar23 = local_118;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_168,pcVar23);
LAB_002caba4:
            local_228.fpclass = cpp_dec_float_finite;
            local_228.prec_elem = 10;
            local_228.data._M_elems[0] = 0;
            local_228.data._M_elems[1] = 0;
            local_228.data._M_elems[2] = 0;
            local_228.data._M_elems[3] = 0;
            local_228.data._M_elems[4] = 0;
            local_228.data._M_elems[5] = 0;
            local_228.data._M_elems._24_5_ = 0;
            local_228.data._M_elems[7]._1_3_ = 0;
            local_228.data._M_elems._32_5_ = 0;
            local_228.data._M_elems[9]._1_3_ = 0;
            local_228.exp = 0;
            local_228.neg = false;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_228,&local_168,&local_108);
            uVar3 = local_228.data._M_elems._0_8_;
            uVar9 = local_228.data._M_elems._8_8_;
            if (((local_228.fpclass != cpp_dec_float_NaN) &&
                (local_1a8.fpclass != cpp_dec_float_NaN)) &&
               (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_228,&local_1a8), uVar3 = local_228.data._M_elems._0_8_,
               uVar9 = local_228.data._M_elems._8_8_, iVar13 < 0)) {
              iVar13 = (*(local_128->
                         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._vptr_SPxRatioTester[3])();
              local_110 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ::id((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         *)CONCAT44(extraout_var_12,iVar13),iVar12);
              local_1a8.data._M_elems[4] = local_228.data._M_elems[4];
              local_1a8.data._M_elems[5] = local_228.data._M_elems[5];
              local_1a8.data._M_elems[7]._1_3_ = local_228.data._M_elems[7]._1_3_;
              local_1a8.data._M_elems._24_5_ = local_228.data._M_elems._24_5_;
              local_1a8.data._M_elems[0] = local_228.data._M_elems[0];
              local_1a8.data._M_elems[1] = local_228.data._M_elems[1];
              local_1a8.data._M_elems[2] = local_228.data._M_elems[2];
              local_1a8.data._M_elems[3] = local_228.data._M_elems[3];
              local_1a8.data._M_elems[9]._1_3_ = local_228.data._M_elems[9]._1_3_;
              local_1a8.data._M_elems._32_5_ = local_228.data._M_elems._32_5_;
              local_1a8.exp = local_228.exp;
              local_1a8.neg = local_228.neg;
              local_1a8.fpclass = local_228.fpclass;
              local_1a8.prec_elem = local_228.prec_elem;
              local_234 = (uint)lVar21;
              uVar3 = local_228.data._M_elems._0_8_;
              uVar9 = local_228.data._M_elems._8_8_;
            }
          }
        }
        local_228.data._M_elems._8_8_ = uVar9;
        local_228.data._M_elems._0_8_ = uVar3;
        lVar21 = lVar21 + 1;
      } while (lVar21 < *(int *)(lVar19 + 0x58));
    }
    lVar21 = local_1b0;
    if (*(int *)(local_1b0 + 0x58) < 1) {
LAB_002cc069:
      lVar17 = local_b8;
      uVar20 = local_1ec;
      max_00 = local_120;
      if ((int)local_234 < 0) goto LAB_002cc411;
      lVar19 = (long)*(int *)(*(long *)(lVar19 + 0x60) + (ulong)local_234 * 4) * 0x38;
      uVar3 = *(undefined8 *)(lVar18 + 0x20 + lVar19);
      local_108.data._M_elems._32_5_ = SUB85(uVar3,0);
      local_108.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_108.data._M_elems._0_8_ = *(undefined8 *)(lVar18 + lVar19);
      local_108.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar18 + lVar19) + 2);
      puVar1 = (uint *)(lVar18 + 0x10 + lVar19);
      local_108.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar3 = *(undefined8 *)(puVar1 + 2);
      local_108.data._M_elems._24_5_ = SUB85(uVar3,0);
      local_108.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_108.exp = *(int *)(lVar18 + 0x28 + lVar19);
      local_108.neg = *(bool *)(lVar18 + 0x2c + lVar19);
      local_108._48_8_ = *(undefined8 *)(lVar18 + 0x30 + lVar19);
      if (((local_108.fpclass != cpp_dec_float_NaN) && (local_a8.fpclass != cpp_dec_float_NaN)) &&
         (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_108,&local_a8), 0 < iVar12)) {
        lVar17 = local_68;
      }
      goto LAB_002cc2aa;
    }
    pdVar14 = (double *)__tls_get_addr(&PTR_003b4b70);
    local_48 = *pdVar14;
    local_118 = &(local_128->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).delta.m_backend;
    uStack_40 = 0;
    local_58 = -local_48;
    uStack_50 = 0x8000000000000000;
    local_1ec = 0xffffffff;
    lVar25 = 0;
    do {
      iVar12 = *(int *)(*(long *)(lVar21 + 0x60) + lVar25 * 4);
      lVar22 = (long)iVar12 * 0x38;
      uVar3 = *(undefined8 *)(lVar17 + 0x20 + lVar22);
      local_108.data._M_elems._32_5_ = SUB85(uVar3,0);
      local_108.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_108.data._M_elems._0_8_ = *(undefined8 *)(lVar17 + lVar22);
      local_108.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar17 + lVar22) + 2);
      puVar1 = (uint *)(lVar17 + 0x10 + lVar22);
      local_108.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar3 = *(undefined8 *)(puVar1 + 2);
      local_108.data._M_elems._24_5_ = SUB85(uVar3,0);
      local_108.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_108.exp = *(int *)(lVar17 + 0x28 + lVar22);
      local_108.neg = *(bool *)(lVar17 + 0x2c + lVar22);
      local_108._48_8_ = *(undefined8 *)(lVar17 + 0x30 + lVar22);
      if (local_a8.fpclass == cpp_dec_float_NaN || local_108.fpclass == cpp_dec_float_NaN) {
LAB_002cbb68:
        uVar6._0_4_ = local_a8.data._M_elems[0];
        uVar6._4_4_ = local_a8.data._M_elems[1];
        local_228.data._M_elems[0] = local_a8.data._M_elems[0];
        local_228.data._M_elems[1] = local_a8.data._M_elems[1];
        uVar7._0_4_ = local_a8.data._M_elems[2];
        uVar7._4_4_ = local_a8.data._M_elems[3];
        local_228.data._M_elems[2] = local_a8.data._M_elems[2];
        local_228.data._M_elems[3] = local_a8.data._M_elems[3];
        local_228.data._M_elems._32_5_ = local_a8.data._M_elems._32_5_;
        local_228.data._M_elems[9]._1_3_ = local_a8.data._M_elems[9]._1_3_;
        local_228.data._M_elems[4] = local_a8.data._M_elems[4];
        local_228.data._M_elems[5] = local_a8.data._M_elems[5];
        local_228.data._M_elems._24_5_ = local_a8.data._M_elems._24_5_;
        local_228.data._M_elems[7]._1_3_ = local_a8.data._M_elems[7]._1_3_;
        local_228.exp = local_a8.exp;
        local_228.neg = local_a8.neg;
        local_228.prec_elem = local_a8.prec_elem;
        local_228.fpclass = local_a8.fpclass;
        if (local_a8.data._M_elems[0] != 0 || local_a8.fpclass != cpp_dec_float_finite) {
          local_228.neg = (bool)(local_a8.neg ^ 1);
        }
        lVar21 = local_1b0;
        uVar3 = uVar6;
        uVar9 = uVar7;
        if (((local_a8.fpclass != cpp_dec_float_NaN) &&
            (uVar3 = local_228.data._M_elems._0_8_, uVar9 = local_228.data._M_elems._8_8_,
            local_108.fpclass != cpp_dec_float_NaN)) &&
           (local_228.data._M_elems._0_8_ = uVar6, local_228.data._M_elems._8_8_ = uVar7,
           iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_108,&local_228), lVar21 = local_1b0,
           uVar3 = local_228.data._M_elems._0_8_, uVar9 = local_228.data._M_elems._8_8_, iVar13 < 0)
           ) {
          ::soplex::infinity::__tls_init();
          pcVar23 = (cpp_dec_float<50U,_int,_void> *)(local_b0 + lVar22);
          local_228.fpclass = cpp_dec_float_finite;
          local_228.prec_elem = 10;
          local_228.data._M_elems[0] = 0;
          local_228.data._M_elems[1] = 0;
          local_228.data._M_elems[2] = 0;
          local_228.data._M_elems[3] = 0;
          local_228.data._M_elems[4] = 0;
          local_228.data._M_elems[5] = 0;
          local_228.data._M_elems._24_5_ = 0;
          local_228.data._M_elems[7]._1_3_ = 0;
          local_228.data._M_elems._32_5_ = 0;
          local_228.data._M_elems[9]._1_3_ = 0;
          local_228.exp = 0;
          local_228.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_228,local_58);
          lVar21 = local_1b0;
          uVar3 = local_228.data._M_elems._0_8_;
          uVar9 = local_228.data._M_elems._8_8_;
          if (((pcVar23->fpclass != cpp_dec_float_NaN) && (local_228.fpclass != cpp_dec_float_NaN))
             && (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    (pcVar23,&local_228), lVar21 = local_1b0,
                uVar3 = local_228.data._M_elems._0_8_, uVar9 = local_228.data._M_elems._8_8_,
                0 < iVar13)) {
            local_1e8.fpclass = cpp_dec_float_finite;
            local_1e8.prec_elem = 10;
            local_1e8.data._M_elems[0] = 0;
            local_1e8.data._M_elems[1] = 0;
            local_1e8.data._M_elems[2] = 0;
            local_1e8.data._M_elems[3] = 0;
            local_1e8.data._M_elems[4] = 0;
            local_1e8.data._M_elems[5] = 0;
            local_1e8.data._M_elems._24_5_ = 0;
            local_1e8.data._M_elems[7]._1_3_ = 0;
            local_1e8.data._M_elems._32_5_ = 0;
            local_1e8.data._M_elems[9]._1_3_ = 0;
            local_1e8.exp = 0;
            local_1e8.neg = false;
            if (&local_1e8 == (cpp_dec_float<50U,_int,_void> *)(lVar22 + local_c0)) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_1e8,pcVar23);
              if (local_1e8.data._M_elems[0] != 0 || local_1e8.fpclass != cpp_dec_float_finite) {
                local_1e8.neg = (bool)(local_1e8.neg ^ 1);
              }
            }
            else {
              if (&local_1e8 != pcVar23) {
                uVar3 = *(undefined8 *)((pcVar23->data)._M_elems + 8);
                local_1e8.data._M_elems._32_5_ = SUB85(uVar3,0);
                local_1e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_1e8.data._M_elems._0_8_ = *(undefined8 *)(pcVar23->data)._M_elems;
                local_1e8.data._M_elems._8_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 2);
                local_1e8.data._M_elems._16_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 4);
                uVar3 = *(undefined8 *)((pcVar23->data)._M_elems + 6);
                local_1e8.data._M_elems._24_5_ = SUB85(uVar3,0);
                local_1e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_1e8.exp = pcVar23->exp;
                local_1e8.neg = pcVar23->neg;
                local_1e8.fpclass = pcVar23->fpclass;
                local_1e8.prec_elem = pcVar23->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_1e8,(cpp_dec_float<50U,_int,_void> *)(lVar22 + local_c0));
            }
            lVar21 = local_1b0;
            local_168.fpclass = cpp_dec_float_finite;
            local_168.prec_elem = 10;
            local_168.data._M_elems[0] = 0;
            local_168.data._M_elems[1] = 0;
            local_168.data._M_elems[2] = 0;
            local_168.data._M_elems[3] = 0;
            local_168.data._M_elems[4] = 0;
            local_168.data._M_elems[5] = 0;
            local_168.data._M_elems._24_5_ = 0;
            local_168.data._M_elems[7]._1_3_ = 0;
            local_168.data._M_elems._32_5_ = 0;
            local_168.data._M_elems[9]._1_3_ = 0;
            local_168.exp = 0;
            local_168.neg = false;
            if (&local_168 == local_118) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_168,&local_1e8);
              if (local_168.data._M_elems[0] != 0 || local_168.fpclass != cpp_dec_float_finite) {
                local_168.neg = (bool)(local_168.neg ^ 1);
              }
            }
            else {
              local_168.data._M_elems._32_5_ = local_1e8.data._M_elems._32_5_;
              local_168.data._M_elems[9]._1_3_ = local_1e8.data._M_elems[9]._1_3_;
              local_168.data._M_elems[4] = local_1e8.data._M_elems[4];
              local_168.data._M_elems[5] = local_1e8.data._M_elems[5];
              local_168.data._M_elems._24_5_ = local_1e8.data._M_elems._24_5_;
              local_168.data._M_elems[7]._1_3_ = local_1e8.data._M_elems[7]._1_3_;
              local_168.data._M_elems[0] = local_1e8.data._M_elems[0];
              local_168.data._M_elems[1] = local_1e8.data._M_elems[1];
              local_168.data._M_elems[2] = local_1e8.data._M_elems[2];
              local_168.data._M_elems[3] = local_1e8.data._M_elems[3];
              local_168.exp = local_1e8.exp;
              local_168.neg = local_1e8.neg;
              local_168.fpclass = local_1e8.fpclass;
              local_168.prec_elem = local_1e8.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_168,local_118);
            }
            goto LAB_002cbeca;
          }
        }
      }
      else {
        iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_108,&local_a8);
        if (iVar13 < 1) {
          goto LAB_002cbb68;
        }
        ::soplex::infinity::__tls_init();
        pcVar23 = (cpp_dec_float<50U,_int,_void> *)(local_60 + lVar22);
        local_228.fpclass = cpp_dec_float_finite;
        local_228.prec_elem = 10;
        local_228.data._M_elems[0] = 0;
        local_228.data._M_elems[1] = 0;
        local_228.data._M_elems[2] = 0;
        local_228.data._M_elems[3] = 0;
        local_228.data._M_elems[4] = 0;
        local_228.data._M_elems[5] = 0;
        local_228.data._M_elems._24_5_ = 0;
        local_228.data._M_elems[7]._1_3_ = 0;
        local_228.data._M_elems._32_5_ = 0;
        local_228.data._M_elems[9]._1_3_ = 0;
        local_228.exp = 0;
        local_228.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_228,local_48);
        lVar21 = local_1b0;
        uVar3 = local_228.data._M_elems._0_8_;
        uVar9 = local_228.data._M_elems._8_8_;
        if (((pcVar23->fpclass != cpp_dec_float_NaN) && (local_228.fpclass != cpp_dec_float_NaN)) &&
           (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (pcVar23,&local_228), lVar21 = local_1b0,
           uVar3 = local_228.data._M_elems._0_8_, uVar9 = local_228.data._M_elems._8_8_, iVar13 < 0)
           ) {
          local_1e8.fpclass = cpp_dec_float_finite;
          local_1e8.prec_elem = 10;
          local_1e8.data._M_elems[0] = 0;
          local_1e8.data._M_elems[1] = 0;
          local_1e8.data._M_elems[2] = 0;
          local_1e8.data._M_elems[3] = 0;
          local_1e8.data._M_elems[4] = 0;
          local_1e8.data._M_elems[5] = 0;
          local_1e8.data._M_elems._24_5_ = 0;
          local_1e8.data._M_elems[7]._1_3_ = 0;
          local_1e8.data._M_elems._32_5_ = 0;
          local_1e8.data._M_elems[9]._1_3_ = 0;
          local_1e8.exp = 0;
          local_1e8.neg = false;
          if (&local_1e8 == (cpp_dec_float<50U,_int,_void> *)(lVar22 + local_c0)) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_1e8,pcVar23);
            if (local_1e8.data._M_elems[0] != 0 || local_1e8.fpclass != cpp_dec_float_finite) {
              local_1e8.neg = (bool)(local_1e8.neg ^ 1);
            }
          }
          else {
            if (&local_1e8 != pcVar23) {
              uVar3 = *(undefined8 *)((pcVar23->data)._M_elems + 8);
              local_1e8.data._M_elems._32_5_ = SUB85(uVar3,0);
              local_1e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_1e8.data._M_elems._0_8_ = *(undefined8 *)(pcVar23->data)._M_elems;
              local_1e8.data._M_elems._8_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 2);
              local_1e8.data._M_elems._16_8_ = *(undefined8 *)((pcVar23->data)._M_elems + 4);
              uVar3 = *(undefined8 *)((pcVar23->data)._M_elems + 6);
              local_1e8.data._M_elems._24_5_ = SUB85(uVar3,0);
              local_1e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_1e8.exp = pcVar23->exp;
              local_1e8.neg = pcVar23->neg;
              local_1e8.fpclass = pcVar23->fpclass;
              local_1e8.prec_elem = pcVar23->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_1e8,(cpp_dec_float<50U,_int,_void> *)(lVar22 + local_c0));
          }
          lVar21 = local_1b0;
          local_168.fpclass = cpp_dec_float_finite;
          local_168.prec_elem = 10;
          local_168.data._M_elems[0] = 0;
          local_168.data._M_elems[1] = 0;
          local_168.data._M_elems[2] = 0;
          local_168.data._M_elems[3] = 0;
          local_168.data._M_elems[4] = 0;
          local_168.data._M_elems[5] = 0;
          local_168.data._M_elems._24_5_ = 0;
          local_168.data._M_elems[7]._1_3_ = 0;
          local_168.data._M_elems._32_5_ = 0;
          local_168.data._M_elems[9]._1_3_ = 0;
          local_168.exp = 0;
          local_168.neg = false;
          pcVar23 = &local_1e8;
          if (&local_168 != local_118) {
            local_168.data._M_elems._32_5_ = local_1e8.data._M_elems._32_5_;
            local_168.data._M_elems[9]._1_3_ = local_1e8.data._M_elems[9]._1_3_;
            local_168.data._M_elems[4] = local_1e8.data._M_elems[4];
            local_168.data._M_elems[5] = local_1e8.data._M_elems[5];
            local_168.data._M_elems._24_5_ = local_1e8.data._M_elems._24_5_;
            local_168.data._M_elems[7]._1_3_ = local_1e8.data._M_elems[7]._1_3_;
            local_168.data._M_elems[0] = local_1e8.data._M_elems[0];
            local_168.data._M_elems[1] = local_1e8.data._M_elems[1];
            local_168.data._M_elems[2] = local_1e8.data._M_elems[2];
            local_168.data._M_elems[3] = local_1e8.data._M_elems[3];
            local_168.exp = local_1e8.exp;
            local_168.neg = local_1e8.neg;
            local_168.fpclass = local_1e8.fpclass;
            local_168.prec_elem = local_1e8.prec_elem;
            pcVar23 = local_118;
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&local_168,pcVar23);
LAB_002cbeca:
          local_228.fpclass = cpp_dec_float_finite;
          local_228.prec_elem = 10;
          local_228.data._M_elems[0] = 0;
          local_228.data._M_elems[1] = 0;
          local_228.data._M_elems[2] = 0;
          local_228.data._M_elems[3] = 0;
          local_228.data._M_elems[4] = 0;
          local_228.data._M_elems[5] = 0;
          local_228.data._M_elems._24_5_ = 0;
          local_228.data._M_elems[7]._1_3_ = 0;
          local_228.data._M_elems._32_5_ = 0;
          local_228.data._M_elems[9]._1_3_ = 0;
          local_228.exp = 0;
          local_228.neg = false;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_228,&local_168,&local_108);
          uVar3 = local_228.data._M_elems._0_8_;
          uVar9 = local_228.data._M_elems._8_8_;
          if (((local_228.fpclass != cpp_dec_float_NaN) && (local_1a8.fpclass != cpp_dec_float_NaN))
             && (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    (&local_228,&local_1a8), uVar3 = local_228.data._M_elems._0_8_,
                uVar9 = local_228.data._M_elems._8_8_, iVar13 < 0)) {
            iVar13 = (*(local_128->
                       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       )._vptr_SPxRatioTester[3])();
            local_110 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ::coId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         *)CONCAT44(extraout_var_15,iVar13),iVar12);
            local_1a8.data._M_elems[4] = local_228.data._M_elems[4];
            local_1a8.data._M_elems[5] = local_228.data._M_elems[5];
            local_1a8.data._M_elems[7]._1_3_ = local_228.data._M_elems[7]._1_3_;
            local_1a8.data._M_elems._24_5_ = local_228.data._M_elems._24_5_;
            local_1a8.data._M_elems[0] = local_228.data._M_elems[0];
            local_1a8.data._M_elems[1] = local_228.data._M_elems[1];
            local_1a8.data._M_elems[2] = local_228.data._M_elems[2];
            local_1a8.data._M_elems[3] = local_228.data._M_elems[3];
            local_1a8.data._M_elems[9]._1_3_ = local_228.data._M_elems[9]._1_3_;
            local_1a8.data._M_elems._32_5_ = local_228.data._M_elems._32_5_;
            local_1a8.exp = local_228.exp;
            local_1a8.neg = local_228.neg;
            local_1a8.fpclass = local_228.fpclass;
            local_1a8.prec_elem = local_228.prec_elem;
            local_1ec = (uint)lVar25;
            uVar3 = local_228.data._M_elems._0_8_;
            uVar9 = local_228.data._M_elems._8_8_;
          }
        }
      }
      local_228.data._M_elems._8_8_ = uVar9;
      local_228.data._M_elems._0_8_ = uVar3;
      lVar22 = local_b0;
      max_00 = local_120;
      uVar20 = local_1ec;
      lVar25 = lVar25 + 1;
    } while (lVar25 < *(int *)(lVar21 + 0x58));
    if ((int)local_1ec < 0) goto LAB_002cc069;
    lVar18 = (long)*(int *)(*(long *)(local_1b0 + 0x60) + (ulong)local_1ec * 4) * 0x38;
    uVar3 = *(undefined8 *)(lVar17 + 0x20 + lVar18);
    local_108.data._M_elems._32_5_ = SUB85(uVar3,0);
    local_108.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
    local_108.data._M_elems._0_8_ = *(undefined8 *)(lVar17 + lVar18);
    local_108.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar17 + lVar18) + 2);
    puVar1 = (uint *)(lVar17 + 0x10 + lVar18);
    local_108.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    uVar3 = *(undefined8 *)(puVar1 + 2);
    local_108.data._M_elems._24_5_ = SUB85(uVar3,0);
    local_108.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
    local_108.exp = *(int *)(lVar17 + 0x28 + lVar18);
    local_108.neg = *(bool *)(lVar17 + 0x2c + lVar18);
    local_108._48_8_ = *(undefined8 *)(lVar17 + 0x30 + lVar18);
    if (((local_108.fpclass != cpp_dec_float_NaN) && (local_a8.fpclass != cpp_dec_float_NaN)) &&
       (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_108,&local_a8), 0 < iVar12)) {
      lVar22 = local_60;
    }
LAB_002cc1fc:
    local_1a8.data._M_elems._32_8_ = *(undefined8 *)(lVar22 + 0x20 + lVar18);
    local_1a8.data._M_elems._0_8_ = *(undefined8 *)(lVar22 + lVar18);
    local_1a8.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar22 + lVar18) + 2);
    puVar1 = (uint *)(lVar22 + 0x10 + lVar18);
    local_1a8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_1a8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_1a8.exp = *(int *)(lVar22 + 0x28 + lVar18);
    local_1a8.neg = *(bool *)(lVar22 + 0x2c + lVar18);
    fVar16 = *(fpclass_type *)(lVar22 + 0x30 + lVar18);
    iVar24 = *(int32_t *)(lVar22 + 0x34 + lVar18);
    local_1a8.prec_elem = iVar24;
    local_1a8.fpclass = fVar16;
    pcVar23 = (cpp_dec_float<50U,_int,_void> *)(local_c0 + lVar18);
  }
  local_168.fpclass = cpp_dec_float_finite;
  local_168.prec_elem = 10;
  local_168.neg = false;
  local_168.exp = 0;
  local_168.data._M_elems[9]._1_3_ = 0;
  local_168.data._M_elems._32_5_ = 0;
  local_168.data._M_elems[7]._1_3_ = 0;
  local_168.data._M_elems._24_5_ = 0;
  local_168.data._M_elems[4] = 0;
  local_168.data._M_elems[5] = 0;
  local_168.data._M_elems[2] = 0;
  local_168.data._M_elems[3] = 0;
  local_168.data._M_elems[0] = 0;
  local_168.data._M_elems[1] = 0;
  if (&local_168 == pcVar23) {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
              (&local_168,&local_1a8);
    if (local_168.data._M_elems[0] != 0 || local_168.fpclass != cpp_dec_float_finite) {
      local_168.neg = (bool)(local_168.neg ^ 1);
    }
  }
  else {
    local_168.data._M_elems._32_5_ = local_1a8.data._M_elems._32_5_;
    local_168.data._M_elems[9]._1_3_ = local_1a8.data._M_elems[9]._1_3_;
    local_168.data._M_elems[4] = local_1a8.data._M_elems[4];
    local_168.data._M_elems[5] = local_1a8.data._M_elems[5];
    local_168.data._M_elems._24_5_ = local_1a8.data._M_elems._24_5_;
    local_168.data._M_elems[7]._1_3_ = local_1a8.data._M_elems[7]._1_3_;
    local_168.data._M_elems[0] = local_1a8.data._M_elems[0];
    local_168.data._M_elems[1] = local_1a8.data._M_elems[1];
    local_168.data._M_elems[2] = local_1a8.data._M_elems[2];
    local_168.data._M_elems[3] = local_1a8.data._M_elems[3];
    local_168.prec_elem = iVar24;
    local_168.fpclass = fVar16;
    local_168.exp = local_1a8.exp;
    local_168.neg = local_1a8.neg;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=(&local_168,pcVar23);
  }
  local_228.fpclass = cpp_dec_float_finite;
  local_228.prec_elem = 10;
  local_228.data._M_elems[0] = 0;
  local_228.data._M_elems[1] = 0;
  local_228.data._M_elems[2] = 0;
  local_228.data._M_elems[3] = 0;
  local_228.data._M_elems[4] = 0;
  local_228.data._M_elems[5] = 0;
  local_228.data._M_elems._24_5_ = 0;
  local_228.data._M_elems[7]._1_3_ = 0;
  local_228.data._M_elems._32_5_ = 0;
  local_228.data._M_elems[9]._1_3_ = 0;
  local_228.exp = 0;
  local_228.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_228,&local_168,&local_108);
  local_1a8.data._M_elems[9]._1_3_ = local_228.data._M_elems[9]._1_3_;
  local_1a8.data._M_elems._32_5_ = local_228.data._M_elems._32_5_;
  local_1a8.data._M_elems[7]._1_3_ = local_228.data._M_elems[7]._1_3_;
  local_1a8.data._M_elems._24_5_ = local_228.data._M_elems._24_5_;
  local_1a8.data._M_elems[4] = local_228.data._M_elems[4];
  local_1a8.data._M_elems[5] = local_228.data._M_elems[5];
  local_1a8.data._M_elems[0] = local_228.data._M_elems[0];
  local_1a8.data._M_elems[1] = local_228.data._M_elems[1];
  local_1a8.data._M_elems[2] = local_228.data._M_elems[2];
  local_1a8.data._M_elems[3] = local_228.data._M_elems[3];
  local_1a8.exp = local_228.exp;
  local_1a8.neg = local_228.neg;
  local_1a8.fpclass = local_228.fpclass;
  local_1a8.prec_elem = local_228.prec_elem;
LAB_002cc411:
  if (local_110.info != 0) {
    iVar12 = (*(local_128->
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._vptr_SPxRatioTester[3])();
    bVar11 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT44(extraout_var_16,iVar12),(SPxId *)&local_110);
    if (bVar11) {
      lVar18 = 0xa58;
      if ((-1 < (int)uVar20) || (lVar18 = 0xa60, uVar20 = local_234, -1 < (int)local_234)) {
        iVar12 = (*(local_128->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._vptr_SPxRatioTester[3])();
        lVar18 = *(long *)(CONCAT44(extraout_var_17,iVar12) + lVar18);
        lVar19 = *(long *)(lVar18 + 0x70);
        lVar17 = (long)*(int *)(*(long *)(lVar18 + 0x60) + (ulong)uVar20 * 4) * 0x38;
        *(undefined8 *)(lVar19 + 0x30 + lVar17) = 0xa00000000;
        *(undefined8 *)(lVar19 + lVar17) = 0;
        ((undefined8 *)(lVar19 + lVar17))[1] = 0;
        puVar2 = (undefined8 *)(lVar19 + 0x10 + lVar17);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2 = (undefined8 *)(lVar19 + 0x1d + lVar17);
        *puVar2 = 0;
        puVar2[1] = 0;
        iVar12 = *(int *)(lVar18 + 0x58);
        *(int *)(lVar18 + 0x58) = iVar12 + -1;
        *(undefined4 *)(*(long *)(lVar18 + 0x60) + (ulong)uVar20 * 4) =
             *(undefined4 *)(*(long *)(lVar18 + 0x60) + -4 + (long)iVar12 * 4);
      }
      DVar15 = (DataKey)selectEnter(local_128,max_00,0,false);
      return (SPxId)DVar15;
    }
  }
  *(undefined8 *)((max_00->m_backend).data._M_elems + 8) = local_1a8.data._M_elems._32_8_;
  *(undefined8 *)((max_00->m_backend).data._M_elems + 4) = local_1a8.data._M_elems._16_8_;
  *(undefined8 *)((max_00->m_backend).data._M_elems + 6) = local_1a8.data._M_elems._24_8_;
  *(undefined8 *)(max_00->m_backend).data._M_elems = local_1a8.data._M_elems._0_8_;
  *(undefined8 *)((max_00->m_backend).data._M_elems + 2) = local_1a8.data._M_elems._8_8_;
  (max_00->m_backend).exp = local_1a8.exp;
  (max_00->m_backend).neg = local_1a8.neg;
  (max_00->m_backend).fpclass = local_1a8.fpclass;
  (max_00->m_backend).prec_elem = local_1a8.prec_elem;
  return (SPxId)local_110;
}

Assistant:

SPxId SPxDefaultRT<R>::selectEnter(R& max, int, bool)
{
   this->solver()->coPvec().delta().setup();
   this->solver()->pVec().delta().setup();

   const R*   pvec = this->solver()->pVec().get_const_ptr();
   const R*   pupd = this->solver()->pVec().delta().values();
   const IdxSet& pidx = this->solver()->pVec().idx();
   const R*   lpb  = this->solver()->lpBound().get_const_ptr();
   const R*   upb  = this->solver()->upBound().get_const_ptr();

   const R*   cvec = this->solver()->coPvec().get_const_ptr();
   const R*   cupd = this->solver()->coPvec().delta().values();
   const IdxSet& cidx = this->solver()->coPvec().idx();
   const R*   lcb  = this->solver()->lcBound().get_const_ptr();
   const R*   ucb  = this->solver()->ucBound().get_const_ptr();

   R epsilon = this->solver()->epsilon();
   R val     = max;
   int  pnum    = -1;
   int  cnum    = -1;

   SPxId enterId;
   int   i;
   int   j;
   R  x;

   // PARALLEL the j loops could be parallelized
   if(val > 0)
   {
      for(j = 0; j < pidx.size(); ++j)
      {
         i = pidx.index(j);
         x = pupd[i];

         if(x > epsilon)
         {
            if(upb[i] < R(infinity))
            {
               R y = (upb[i] - pvec[i] + this->delta) / x;

               if(y < val)
               {
                  enterId = this->solver()->id(i);
                  val     = y;
                  pnum    = j;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(lpb[i] > R(-infinity))
            {
               R y = (lpb[i] - pvec[i] - this->delta) / x;

               if(y < val)
               {
                  enterId = this->solver()->id(i);
                  val     = y;
                  pnum    = j;
               }
            }
         }
      }

      for(j = 0; j < cidx.size(); ++j)
      {
         i = cidx.index(j);
         x = cupd[i];

         if(x > epsilon)
         {
            if(ucb[i] < R(infinity))
            {
               R y = (ucb[i] - cvec[i] + this->delta) / x;

               if(y < val)
               {
                  enterId = this->solver()->coId(i);
                  val     = y;
                  cnum    = j;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(lcb[i] > R(-infinity))
            {
               R y = (lcb[i] - cvec[i] - this->delta) / x;

               if(y < val)
               {
                  enterId = this->solver()->coId(i);
                  val     = y;
                  cnum    = j;
               }
            }
         }
      }

      if(cnum >= 0)
      {
         i   = cidx.index(cnum);
         x   = cupd[i];
         val = (x > epsilon) ? ucb[i] : lcb[i];
         val = (val - cvec[i]) / x;
      }
      else if(pnum >= 0)
      {
         i   = pidx.index(pnum);
         x   = pupd[i];
         val = (x > epsilon) ? upb[i] : lpb[i];
         val = (val - pvec[i]) / x;
      }
   }
   else
   {
      for(j = 0; j < pidx.size(); ++j)
      {
         i = pidx.index(j);
         x = pupd[i];

         if(x > epsilon)
         {
            if(lpb[i] > R(-infinity))
            {
               R y = (lpb[i] - pvec[i] - this->delta) / x;

               if(y > val)
               {
                  enterId = this->solver()->id(i);
                  val     = y;
                  pnum    = j;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(upb[i] < R(infinity))
            {
               R y = (upb[i] - pvec[i] + this->delta) / x;

               if(y > val)
               {
                  enterId = this->solver()->id(i);
                  val     = y;
                  pnum    = j;
               }
            }
         }
      }

      for(j = 0; j < cidx.size(); ++j)
      {
         i = cidx.index(j);
         x = cupd[i];

         if(x > epsilon)
         {
            if(lcb[i] > R(-infinity))
            {
               R y = (lcb[i] - cvec[i] - this->delta) / x;

               if(y > val)
               {
                  enterId = this->solver()->coId(i);
                  val     = y;
                  cnum    = j;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(ucb[i] < R(infinity))
            {
               R y = (ucb[i] - cvec[i] + this->delta) / x;

               if(y > val)
               {
                  enterId = this->solver()->coId(i);
                  val     = y;
                  cnum    = j;
               }
            }
         }
      }

      if(cnum >= 0)
      {
         i   = cidx.index(cnum);
         x   = cupd[i];
         val = (x < epsilon) ? ucb[i] : lcb[i];
         val = (val - cvec[i]) / x;
      }
      else if(pnum >= 0)
      {
         i   = pidx.index(pnum);
         x   = pupd[i];
         val = (x < epsilon) ? upb[i] : lpb[i];
         val = (val - pvec[i]) / x;
      }
   }

   if(enterId.isValid() && this->solver()->isBasic(enterId))
   {
      SPxOut::debug(this, "DDEFRT01 isValid() && isBasic(): max={}\n", max);

      if(cnum >= 0)
         this->solver()->coPvec().delta().clearNum(cnum);
      else if(pnum >= 0)
         this->solver()->pVec().delta().clearNum(pnum);

      return SPxDefaultRT<R>::selectEnter(max, 0, false);
   }

   SPX_DEBUG(

      if(!enterId.isValid())
      std::cout << "DDEFRT02 !isValid(): max=" << max << ", x=" << x << std::endl;
   )
      max = val;

   return enterId;
}